

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void dequantize_row_iq3_s(block_iq3_s *x,float *y,int64_t k)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar5;
  float fVar6;
  float fVar7;
  int j_1;
  uint8_t *grid2_1;
  uint8_t *grid1_1;
  int l_1;
  int j;
  uint8_t *grid2;
  uint8_t *grid1;
  int l;
  float db2;
  float db1;
  int ib32;
  uint8_t *signs;
  uint8_t *qh;
  uint8_t *qs;
  float d;
  int i;
  int64_t nb;
  float local_b8;
  float local_ac;
  float local_a0;
  float local_94;
  int local_7c;
  int local_68;
  int local_64;
  int local_50;
  int local_44;
  long local_40;
  byte *local_38;
  long local_30;
  int local_24;
  long local_10;
  
  local_10 = in_RSI;
  for (local_24 = 0; (long)local_24 < in_RDX / 0x100; local_24 = local_24 + 1) {
    fVar5 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_RDI + (long)local_24 * 0x6e));
    local_30 = in_RDI + (long)local_24 * 0x6e + 2;
    local_38 = (byte *)(in_RDI + (long)local_24 * 0x6e + 0x42);
    local_40 = in_RDI + (long)local_24 * 0x6e + 0x4a;
    for (local_44 = 0; local_44 < 8; local_44 = local_44 + 2) {
      fVar6 = fVar5 * (float)(byte)((*(byte *)(in_RDI + (long)local_24 * 0x6e + 0x6a +
                                              (long)(local_44 / 2)) & 0xf) * '\x02' + 1);
      fVar7 = fVar5 * (float)(((int)(uint)*(byte *)(in_RDI + (long)local_24 * 0x6e + 0x6a +
                                                   (long)(local_44 / 2)) >> 4) * 2 + 1);
      for (local_50 = 0; local_50 < 4; local_50 = local_50 + 1) {
        bVar1 = *(byte *)(local_30 + (local_50 << 1));
        bVar2 = *local_38;
        bVar3 = *(byte *)(local_30 + (local_50 * 2 + 1));
        bVar4 = *local_38;
        for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
          local_94 = -1.0;
          if ((*(byte *)(local_40 + local_50) & kmask_iq2xs[local_64]) == 0) {
            local_94 = 1.0;
          }
          *(float *)(local_10 + (long)local_64 * 4) =
               fVar6 * (float)*(byte *)((long)iq3s_grid +
                                       (long)local_64 +
                                       (long)(int)((uint)bVar1 |
                                                  (uint)bVar2 << ((char)local_50 * -2 + 8U & 0x1f) &
                                                  0x100) * 4) * local_94;
          local_a0 = -1.0;
          if ((*(byte *)(local_40 + local_50) & kmask_iq2xs[local_64 + 4]) == 0) {
            local_a0 = 1.0;
          }
          *(float *)(local_10 + (long)(local_64 + 4) * 4) =
               fVar6 * (float)*(byte *)((long)iq3s_grid +
                                       (long)local_64 +
                                       (long)(int)((uint)bVar3 |
                                                  (uint)bVar4 << ((char)local_50 * -2 + 7U & 0x1f) &
                                                  0x100) * 4) * local_a0;
        }
        local_10 = local_10 + 0x20;
      }
      for (local_68 = 0; local_68 < 4; local_68 = local_68 + 1) {
        bVar1 = *(byte *)(local_30 + 8 + (long)(local_68 << 1));
        bVar2 = local_38[1];
        bVar3 = *(byte *)(local_30 + 8 + (long)(local_68 * 2 + 1));
        bVar4 = local_38[1];
        for (local_7c = 0; local_7c < 4; local_7c = local_7c + 1) {
          local_ac = -1.0;
          if ((*(byte *)(local_40 + 4 + (long)local_68) & kmask_iq2xs[local_7c]) == 0) {
            local_ac = 1.0;
          }
          *(float *)(local_10 + (long)local_7c * 4) =
               fVar7 * (float)*(byte *)((long)iq3s_grid +
                                       (long)local_7c +
                                       (long)(int)((uint)bVar1 |
                                                  (uint)bVar2 << ((char)local_68 * -2 + 8U & 0x1f) &
                                                  0x100) * 4) * local_ac;
          local_b8 = -1.0;
          if ((*(byte *)(local_40 + 4 + (long)local_68) & kmask_iq2xs[local_7c + 4]) == 0) {
            local_b8 = 1.0;
          }
          *(float *)(local_10 + (long)(local_7c + 4) * 4) =
               fVar7 * (float)*(byte *)((long)iq3s_grid +
                                       (long)local_7c +
                                       (long)(int)((uint)bVar3 |
                                                  (uint)bVar4 << ((char)local_68 * -2 + 7U & 0x1f) &
                                                  0x100) * 4) * local_b8;
        }
        local_10 = local_10 + 0x20;
      }
      local_38 = local_38 + 2;
      local_30 = local_30 + 0x10;
      local_40 = local_40 + 8;
    }
  }
  return;
}

Assistant:

void dequantize_row_iq3_s(const block_iq3_s * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    for (int i = 0; i < nb; i++) {

        const float d = GGML_FP16_TO_FP32(x[i].d);
        const uint8_t * qs = x[i].qs;
        const uint8_t * qh = x[i].qh;
        const uint8_t * signs = x[i].signs;

        for (int ib32 = 0; ib32 < QK_K/32; ib32 += 2) {
            const float db1 = d * (1 + 2*(x[i].scales[ib32/2] & 0xf));
            const float db2 = d * (1 + 2*(x[i].scales[ib32/2] >>  4));
            for (int l = 0; l < 4; ++l) {
                const uint8_t * grid1 = (const uint8_t *)(iq3s_grid + (qs[2*l+0] | ((qh[0] << (8-2*l)) & 256)));
                const uint8_t * grid2 = (const uint8_t *)(iq3s_grid + (qs[2*l+1] | ((qh[0] << (7-2*l)) & 256)));
                for (int j = 0; j < 4; ++j) {
                    y[j+0] = db1 * grid1[j] * (signs[l] & kmask_iq2xs[j+0] ? -1.f : 1.f);
                    y[j+4] = db1 * grid2[j] * (signs[l] & kmask_iq2xs[j+4] ? -1.f : 1.f);
                }
                y += 8;
            }
            qs += 8;
            signs += 4;
            for (int l = 0; l < 4; ++l) {
                const uint8_t * grid1 = (const uint8_t *)(iq3s_grid + (qs[2*l+0] | ((qh[1] << (8-2*l)) & 256)));
                const uint8_t * grid2 = (const uint8_t *)(iq3s_grid + (qs[2*l+1] | ((qh[1] << (7-2*l)) & 256)));
                for (int j = 0; j < 4; ++j) {
                    y[j+0] = db2 * grid1[j] * (signs[l] & kmask_iq2xs[j+0] ? -1.f : 1.f);
                    y[j+4] = db2 * grid2[j] * (signs[l] & kmask_iq2xs[j+4] ? -1.f : 1.f);
                }
                y += 8;
            }
            qh += 2;
            qs += 8;
            signs += 4;
        }
    }
}